

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlCatalogXMLResolve(xmlCatalogEntryPtr catal,xmlChar *pubID,xmlChar *sysID)

{
  xmlCatalogEntryType xVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  int local_390;
  int local_38c;
  int i_1;
  int nbList_1;
  xmlChar *delegates_1 [50];
  int local_1f0;
  int local_1ec;
  int i;
  int nbList;
  xmlChar *delegates [50];
  int local_4c;
  int len;
  int lenrewrite;
  xmlCatalogEntryPtr rewrite;
  int haveNext;
  int haveDelegate;
  xmlCatalogEntryPtr cur;
  xmlChar *ret;
  xmlChar *sysID_local;
  xmlChar *pubID_local;
  xmlCatalogEntryPtr catal_local;
  
  rewrite._0_4_ = 0;
  if (0x32 < catal->depth) {
    xmlCatalogErr(catal,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",catal->name,
                  (xmlChar *)0x0,(xmlChar *)0x0);
    return (xmlChar *)0x0;
  }
  catal->depth = catal->depth + 1;
  if (sysID != (xmlChar *)0x0) {
    _len = (xmlCatalogEntryPtr)0x0;
    local_4c = 0;
    rewrite._4_4_ = 0;
    for (_haveNext = catal; _haveNext != (xmlCatalogEntryPtr)0x0; _haveNext = _haveNext->next) {
      switch(_haveNext->type) {
      case XML_CATA_NEXT_CATALOG:
        rewrite._0_4_ = (int)rewrite + 1;
        break;
      default:
        break;
      case XML_CATA_SYSTEM:
        iVar3 = xmlStrEqual(sysID,_haveNext->name);
        if (iVar3 != 0) {
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("Found system match %s, using %s\n",_haveNext->name,_haveNext->URL)
            ;
          }
          catal->depth = catal->depth + -1;
          pxVar4 = xmlStrdup(_haveNext->URL);
          return pxVar4;
        }
        break;
      case XML_CATA_REWRITE_SYSTEM:
        iVar3 = xmlStrlen(_haveNext->name);
        if ((local_4c < iVar3) && (iVar2 = xmlStrncmp(sysID,_haveNext->name,iVar3), iVar2 == 0)) {
          _len = _haveNext;
          local_4c = iVar3;
        }
        break;
      case XML_CATA_DELEGATE_SYSTEM:
        pxVar4 = _haveNext->name;
        iVar3 = xmlStrlen(_haveNext->name);
        iVar3 = xmlStrncmp(sysID,pxVar4,iVar3);
        if (iVar3 == 0) {
          rewrite._4_4_ = rewrite._4_4_ + 1;
        }
      }
    }
    if (_len != (xmlCatalogEntryPtr)0x0) {
      if (xmlDebugCatalogs != 0) {
        xmlCatalogPrintDebug("Using rewriting rule %s\n",_len->name);
      }
      cur = (xmlCatalogEntryPtr)xmlStrdup(_len->URL);
      if (cur != (xmlCatalogEntryPtr)0x0) {
        cur = (xmlCatalogEntryPtr)xmlStrcat((xmlChar *)cur,sysID + local_4c);
      }
      catal->depth = catal->depth + -1;
      return (xmlChar *)cur;
    }
    if (rewrite._4_4_ != 0) {
      local_1ec = 0;
      _haveNext = catal;
      do {
        while( true ) {
          if (_haveNext == (xmlCatalogEntryPtr)0x0) {
            catal->depth = catal->depth + -1;
            return (xmlChar *)0xffffffffffffffff;
          }
          if (_haveNext->type == XML_CATA_DELEGATE_SYSTEM) break;
LAB_0018ce42:
          _haveNext = _haveNext->next;
        }
        pxVar4 = _haveNext->name;
        iVar3 = xmlStrlen(_haveNext->name);
        iVar3 = xmlStrncmp(sysID,pxVar4,iVar3);
        if (iVar3 != 0) goto LAB_0018ce42;
        local_1f0 = 0;
        while ((local_1f0 < local_1ec &&
               (iVar3 = xmlStrEqual(_haveNext->URL,*(xmlChar **)(&i + (long)local_1f0 * 2)),
               iVar3 == 0))) {
          local_1f0 = local_1f0 + 1;
        }
        if (local_1ec <= local_1f0) {
          if (local_1ec < 0x32) {
            *(xmlChar **)(&i + (long)local_1ec * 2) = _haveNext->URL;
            local_1ec = local_1ec + 1;
          }
          if (_haveNext->children == (_xmlCatalogEntry *)0x0) {
            xmlFetchXMLCatalogFile(_haveNext);
          }
          if (_haveNext->children != (_xmlCatalogEntry *)0x0) {
            if (xmlDebugCatalogs != 0) {
              xmlCatalogPrintDebug("Trying system delegate %s\n",_haveNext->URL);
            }
            pxVar4 = xmlCatalogListXMLResolve(_haveNext->children,(xmlChar *)0x0,sysID);
            if (pxVar4 != (xmlChar *)0x0) {
              catal->depth = catal->depth + -1;
              return pxVar4;
            }
          }
          goto LAB_0018ce42;
        }
        _haveNext = _haveNext->next;
      } while( true );
    }
  }
  if (pubID != (xmlChar *)0x0) {
    rewrite._4_4_ = 0;
    for (_haveNext = catal; _haveNext != (xmlCatalogEntryPtr)0x0; _haveNext = _haveNext->next) {
      xVar1 = _haveNext->type;
      if (xVar1 == XML_CATA_NEXT_CATALOG) {
        if (sysID == (xmlChar *)0x0) {
          rewrite._0_4_ = (int)rewrite + 1;
        }
      }
      else if (xVar1 == XML_CATA_PUBLIC) {
        iVar3 = xmlStrEqual(pubID,_haveNext->name);
        if (iVar3 != 0) {
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("Found public match %s\n",_haveNext->name);
          }
          catal->depth = catal->depth + -1;
          pxVar4 = xmlStrdup(_haveNext->URL);
          return pxVar4;
        }
      }
      else if (xVar1 == XML_CATA_DELEGATE_PUBLIC) {
        pxVar4 = _haveNext->name;
        iVar3 = xmlStrlen(_haveNext->name);
        iVar3 = xmlStrncmp(pubID,pxVar4,iVar3);
        if ((iVar3 == 0) && (_haveNext->prefer == XML_CATA_PREFER_PUBLIC)) {
          rewrite._4_4_ = rewrite._4_4_ + 1;
        }
      }
    }
    if (rewrite._4_4_ != 0) {
      local_38c = 0;
      _haveNext = catal;
      do {
        while( true ) {
          if (_haveNext == (xmlCatalogEntryPtr)0x0) {
            catal->depth = catal->depth + -1;
            return (xmlChar *)0xffffffffffffffff;
          }
          if ((_haveNext->type == XML_CATA_DELEGATE_PUBLIC) &&
             (_haveNext->prefer == XML_CATA_PREFER_PUBLIC)) break;
LAB_0018d13b:
          _haveNext = _haveNext->next;
        }
        pxVar4 = _haveNext->name;
        iVar3 = xmlStrlen(_haveNext->name);
        iVar3 = xmlStrncmp(pubID,pxVar4,iVar3);
        if (iVar3 != 0) goto LAB_0018d13b;
        local_390 = 0;
        while ((local_390 < local_38c &&
               (iVar3 = xmlStrEqual(_haveNext->URL,*(xmlChar **)(&i_1 + (long)local_390 * 2)),
               iVar3 == 0))) {
          local_390 = local_390 + 1;
        }
        if (local_38c <= local_390) {
          if (local_38c < 0x32) {
            *(xmlChar **)(&i_1 + (long)local_38c * 2) = _haveNext->URL;
            local_38c = local_38c + 1;
          }
          if (_haveNext->children == (_xmlCatalogEntry *)0x0) {
            xmlFetchXMLCatalogFile(_haveNext);
          }
          if (_haveNext->children != (_xmlCatalogEntry *)0x0) {
            if (xmlDebugCatalogs != 0) {
              xmlCatalogPrintDebug("Trying public delegate %s\n",_haveNext->URL);
            }
            pxVar4 = xmlCatalogListXMLResolve(_haveNext->children,pubID,(xmlChar *)0x0);
            if (pxVar4 != (xmlChar *)0x0) {
              catal->depth = catal->depth + -1;
              return pxVar4;
            }
          }
          goto LAB_0018d13b;
        }
        _haveNext = _haveNext->next;
      } while( true );
    }
  }
  _haveNext = catal;
  if ((int)rewrite != 0) {
    for (; _haveNext != (xmlCatalogEntryPtr)0x0; _haveNext = _haveNext->next) {
      if (_haveNext->type == XML_CATA_NEXT_CATALOG) {
        if (_haveNext->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(_haveNext);
        }
        if (_haveNext->children != (_xmlCatalogEntry *)0x0) {
          pxVar4 = xmlCatalogListXMLResolve(_haveNext->children,pubID,sysID);
          if (pxVar4 != (xmlChar *)0x0) {
            catal->depth = catal->depth + -1;
            return pxVar4;
          }
          if (0x32 < catal->depth) {
            return (xmlChar *)0x0;
          }
        }
      }
    }
  }
  catal->depth = catal->depth + -1;
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlCatalogXMLResolve(xmlCatalogEntryPtr catal, const xmlChar *pubID,
	              const xmlChar *sysID) {
    xmlChar *ret = NULL;
    xmlCatalogEntryPtr cur;
    int haveDelegate = 0;
    int haveNext = 0;

    /*
     * protection against loops
     */
    if (catal->depth > MAX_CATAL_DEPTH) {
	xmlCatalogErr(catal, NULL, XML_CATALOG_RECURSION,
		      "Detected recursion in catalog %s\n",
		      catal->name, NULL, NULL);
	return(NULL);
    }
    catal->depth++;

    /*
     * First tries steps 2/ 3/ 4/ if a system ID is provided.
     */
    if (sysID != NULL) {
	xmlCatalogEntryPtr rewrite = NULL;
	int lenrewrite = 0, len;
	cur = catal;
	haveDelegate = 0;
	while (cur != NULL) {
	    switch (cur->type) {
		case XML_CATA_SYSTEM:
		    if (xmlStrEqual(sysID, cur->name)) {
			if (xmlDebugCatalogs)
			    xmlCatalogPrintDebug(
				    "Found system match %s, using %s\n",
				            cur->name, cur->URL);
			catal->depth--;
			return(xmlStrdup(cur->URL));
		    }
		    break;
		case XML_CATA_REWRITE_SYSTEM:
		    len = xmlStrlen(cur->name);
		    if ((len > lenrewrite) &&
			(!xmlStrncmp(sysID, cur->name, len))) {
			lenrewrite = len;
			rewrite = cur;
		    }
		    break;
		case XML_CATA_DELEGATE_SYSTEM:
		    if (!xmlStrncmp(sysID, cur->name, xmlStrlen(cur->name)))
			haveDelegate++;
		    break;
		case XML_CATA_NEXT_CATALOG:
		    haveNext++;
		    break;
		default:
		    break;
	    }
	    cur = cur->next;
	}
	if (rewrite != NULL) {
	    if (xmlDebugCatalogs)
		xmlCatalogPrintDebug(
			"Using rewriting rule %s\n", rewrite->name);
	    ret = xmlStrdup(rewrite->URL);
	    if (ret != NULL)
		ret = xmlStrcat(ret, &sysID[lenrewrite]);
	    catal->depth--;
	    return(ret);
	}
	if (haveDelegate) {
	    const xmlChar *delegates[MAX_DELEGATE];
	    int nbList = 0, i;

	    /*
	     * Assume the entries have been sorted by decreasing substring
	     * matches when the list was produced.
	     */
	    cur = catal;
	    while (cur != NULL) {
		if ((cur->type == XML_CATA_DELEGATE_SYSTEM) &&
		    (!xmlStrncmp(sysID, cur->name, xmlStrlen(cur->name)))) {
		    for (i = 0;i < nbList;i++)
			if (xmlStrEqual(cur->URL, delegates[i]))
			    break;
		    if (i < nbList) {
			cur = cur->next;
			continue;
		    }
		    if (nbList < MAX_DELEGATE)
			delegates[nbList++] = cur->URL;

		    if (cur->children == NULL) {
			xmlFetchXMLCatalogFile(cur);
		    }
		    if (cur->children != NULL) {
			if (xmlDebugCatalogs)
			    xmlCatalogPrintDebug(
				    "Trying system delegate %s\n", cur->URL);
			ret = xmlCatalogListXMLResolve(
				cur->children, NULL, sysID);
			if (ret != NULL) {
			    catal->depth--;
			    return(ret);
			}
		    }
		}
		cur = cur->next;
	    }
	    /*
	     * Apply the cut algorithm explained in 4/
	     */
	    catal->depth--;
	    return(XML_CATAL_BREAK);
	}
    }
    /*
     * Then tries 5/ 6/ if a public ID is provided
     */
    if (pubID != NULL) {
	cur = catal;
	haveDelegate = 0;
	while (cur != NULL) {
	    switch (cur->type) {
		case XML_CATA_PUBLIC:
		    if (xmlStrEqual(pubID, cur->name)) {
			if (xmlDebugCatalogs)
			    xmlCatalogPrintDebug(
				    "Found public match %s\n", cur->name);
			catal->depth--;
			return(xmlStrdup(cur->URL));
		    }
		    break;
		case XML_CATA_DELEGATE_PUBLIC:
		    if (!xmlStrncmp(pubID, cur->name, xmlStrlen(cur->name)) &&
			(cur->prefer == XML_CATA_PREFER_PUBLIC))
			haveDelegate++;
		    break;
		case XML_CATA_NEXT_CATALOG:
		    if (sysID == NULL)
			haveNext++;
		    break;
		default:
		    break;
	    }
	    cur = cur->next;
	}
	if (haveDelegate) {
	    const xmlChar *delegates[MAX_DELEGATE];
	    int nbList = 0, i;

	    /*
	     * Assume the entries have been sorted by decreasing substring
	     * matches when the list was produced.
	     */
	    cur = catal;
	    while (cur != NULL) {
		if ((cur->type == XML_CATA_DELEGATE_PUBLIC) &&
		    (cur->prefer == XML_CATA_PREFER_PUBLIC) &&
		    (!xmlStrncmp(pubID, cur->name, xmlStrlen(cur->name)))) {

		    for (i = 0;i < nbList;i++)
			if (xmlStrEqual(cur->URL, delegates[i]))
			    break;
		    if (i < nbList) {
			cur = cur->next;
			continue;
		    }
		    if (nbList < MAX_DELEGATE)
			delegates[nbList++] = cur->URL;

		    if (cur->children == NULL) {
			xmlFetchXMLCatalogFile(cur);
		    }
		    if (cur->children != NULL) {
			if (xmlDebugCatalogs)
			    xmlCatalogPrintDebug(
				    "Trying public delegate %s\n", cur->URL);
			ret = xmlCatalogListXMLResolve(
				cur->children, pubID, NULL);
			if (ret != NULL) {
			    catal->depth--;
			    return(ret);
			}
		    }
		}
		cur = cur->next;
	    }
	    /*
	     * Apply the cut algorithm explained in 4/
	     */
	    catal->depth--;
	    return(XML_CATAL_BREAK);
	}
    }
    if (haveNext) {
	cur = catal;
	while (cur != NULL) {
	    if (cur->type == XML_CATA_NEXT_CATALOG) {
		if (cur->children == NULL) {
		    xmlFetchXMLCatalogFile(cur);
		}
		if (cur->children != NULL) {
		    ret = xmlCatalogListXMLResolve(cur->children, pubID, sysID);
		    if (ret != NULL) {
			catal->depth--;
			return(ret);
		    } else if (catal->depth > MAX_CATAL_DEPTH) {
		        return(NULL);
		    }
		}
	    }
	    cur = cur->next;
	}
    }

    catal->depth--;
    return(NULL);
}